

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265e_vepu540c.c
# Opt level: O0

void vepu540c_h265_set_hw_address
               (H265eV540cHalContext *ctx,hevc_vepu540c_base *regs,HalEncTask *task)

{
  MppBuffer buffer;
  void *pvVar1;
  MppDev pvVar2;
  RK_U32 RVar3;
  HalBuf *pHVar4;
  HalBuf *pHVar5;
  size_t sVar6;
  H265eSyntax_new *syn;
  MppBuffer md_info_buf;
  HalBuf *ref_buf;
  HalBuf *recon_buf;
  HalEncTask *enc_task;
  HalEncTask *task_local;
  hevc_vepu540c_base *regs_local;
  H265eV540cHalContext *ctx_local;
  
  buffer = task->md_info;
  pvVar1 = (task->syntax).data;
  if ((hal_h265e_debug & 4) != 0) {
    _mpp_log_l(4,"hal_h265e_v540c","(%d) enter\n",(char *)0x0,0x42c);
  }
  RVar3 = mpp_buffer_get_fd_with_caller(task->input,"vepu540c_h265_set_hw_address");
  regs->reg0160_adr_src0 = RVar3;
  regs->reg0161_adr_src1 = regs->reg0160_adr_src0;
  regs->reg0162_adr_src2 = regs->reg0160_adr_src0;
  pHVar4 = hal_bufs_get_buf(ctx->dpb_bufs,(uint)*(byte *)((long)pvVar1 + 0xe8));
  pHVar5 = hal_bufs_get_buf(ctx->dpb_bufs,(uint)*(byte *)((long)pvVar1 + 0xe9));
  if (*(int *)((long)pvVar1 + 0x120) == 0) {
    RVar3 = mpp_buffer_get_fd_with_caller(*pHVar4->buf,"vepu540c_h265_set_hw_address");
    regs->reg0163_rfpw_h_addr = RVar3;
    regs->reg0164_rfpw_b_addr = regs->reg0163_rfpw_h_addr;
    mpp_dev_set_reg_offset(ctx->dev,0xa4,ctx->fbc_header_len);
  }
  RVar3 = mpp_buffer_get_fd_with_caller(*pHVar5->buf,"vepu540c_h265_set_hw_address");
  regs->reg0165_rfpr_h_addr = RVar3;
  regs->reg0166_rfpr_b_addr = regs->reg0165_rfpr_h_addr;
  RVar3 = mpp_buffer_get_fd_with_caller(pHVar4->buf[2],"vepu540c_h265_set_hw_address");
  regs->reg0167_cmvw_addr = RVar3;
  RVar3 = mpp_buffer_get_fd_with_caller(pHVar5->buf[2],"vepu540c_h265_set_hw_address");
  regs->reg0168_cmvr_addr = RVar3;
  RVar3 = mpp_buffer_get_fd_with_caller(pHVar4->buf[1],"vepu540c_h265_set_hw_address");
  regs->reg0169_dspw_addr = RVar3;
  RVar3 = mpp_buffer_get_fd_with_caller(pHVar5->buf[1],"vepu540c_h265_set_hw_address");
  regs->reg0170_dspr_addr = RVar3;
  mpp_dev_set_reg_offset(ctx->dev,0xa6,ctx->fbc_header_len);
  if (buffer == (MppBuffer)0x0) {
    regs->reg0192_enc_pic =
         (anon_struct_4_11_d5ed75f1_for_reg0192_enc_pic)((uint)regs->reg0192_enc_pic & 0xfffffff7);
    regs->reg0171_meiw_addr = 0;
  }
  else {
    regs->reg0192_enc_pic =
         (anon_struct_4_11_d5ed75f1_for_reg0192_enc_pic)
         ((uint)regs->reg0192_enc_pic & 0xfffffff7 | 8);
    RVar3 = mpp_buffer_get_fd_with_caller(buffer,"vepu540c_h265_set_hw_address");
    regs->reg0171_meiw_addr = RVar3;
  }
  RVar3 = mpp_buffer_get_fd_with_caller(task->output,"vepu540c_h265_set_hw_address");
  regs->reg0172_bsbt_addr = RVar3;
  regs->reg0173_bsbb_addr = regs->reg0172_bsbt_addr;
  regs->reg0175_bsbr_addr = regs->reg0172_bsbt_addr;
  regs->reg0174_adr_bsbs = regs->reg0172_bsbt_addr;
  regs->reg0180_adr_rfpt_h = 0xffffffff;
  regs->reg0181_adr_rfpb_h = 0;
  regs->reg0182_adr_rfpt_b = 0xffffffff;
  regs->reg0183_adr_rfpb_b = 0;
  pvVar2 = ctx->dev;
  sVar6 = mpp_packet_get_length(task->packet);
  mpp_dev_set_reg_offset(pvVar2,0xae,(RK_U32)sVar6);
  pvVar2 = ctx->dev;
  sVar6 = mpp_buffer_get_size_with_caller(task->output,"vepu540c_h265_set_hw_address");
  mpp_dev_set_reg_offset(pvVar2,0xac,(RK_U32)sVar6);
  RVar3 = mpp_frame_get_offset_y(task->frame);
  regs->reg0204_pic_ofst =
       (anon_struct_4_4_fd8500c5_for_reg0204_pic_ofst)
       ((uint)regs->reg0204_pic_ofst & 0xc000ffff | (RVar3 & 0x3fff) << 0x10);
  RVar3 = mpp_frame_get_offset_x(task->frame);
  regs->reg0204_pic_ofst =
       (anon_struct_4_4_fd8500c5_for_reg0204_pic_ofst)
       ((uint)regs->reg0204_pic_ofst & 0xffffc000 | RVar3 & 0x3fff);
  return;
}

Assistant:

void vepu540c_h265_set_hw_address(H265eV540cHalContext *ctx, hevc_vepu540c_base *regs, HalEncTask *task)
{
    HalEncTask *enc_task = task;
    HalBuf *recon_buf, *ref_buf;
    MppBuffer md_info_buf = enc_task->md_info;
    H265eSyntax_new *syn = (H265eSyntax_new *)enc_task->syntax.data;

    hal_h265e_enter();

    regs->reg0160_adr_src0     = mpp_buffer_get_fd(enc_task->input);
    regs->reg0161_adr_src1     = regs->reg0160_adr_src0;
    regs->reg0162_adr_src2     = regs->reg0160_adr_src0;

    recon_buf = hal_bufs_get_buf(ctx->dpb_bufs, syn->sp.recon_pic.slot_idx);
    ref_buf = hal_bufs_get_buf(ctx->dpb_bufs, syn->sp.ref_pic.slot_idx);

    if (!syn->sp.non_reference_flag) {
        regs->reg0163_rfpw_h_addr  = mpp_buffer_get_fd(recon_buf->buf[0]);
        regs->reg0164_rfpw_b_addr  = regs->reg0163_rfpw_h_addr;
        mpp_dev_set_reg_offset(ctx->dev, 164, ctx->fbc_header_len);
    }
    regs->reg0165_rfpr_h_addr = mpp_buffer_get_fd(ref_buf->buf[0]);
    regs->reg0166_rfpr_b_addr = regs->reg0165_rfpr_h_addr;
    regs->reg0167_cmvw_addr = mpp_buffer_get_fd(recon_buf->buf[2]);
    regs->reg0168_cmvr_addr = mpp_buffer_get_fd(ref_buf->buf[2]);
    regs->reg0169_dspw_addr = mpp_buffer_get_fd(recon_buf->buf[1]);
    regs->reg0170_dspr_addr = mpp_buffer_get_fd(ref_buf->buf[1]);

    mpp_dev_set_reg_offset(ctx->dev, 166, ctx->fbc_header_len);

    if (md_info_buf) {
        regs->reg0192_enc_pic.mei_stor    = 1;
        regs->reg0171_meiw_addr = mpp_buffer_get_fd(md_info_buf);
    } else {
        regs->reg0192_enc_pic.mei_stor    = 0;
        regs->reg0171_meiw_addr = 0;
    }

    regs->reg0172_bsbt_addr = mpp_buffer_get_fd(enc_task->output);
    /* TODO: stream size relative with syntax */
    regs->reg0173_bsbb_addr  = regs->reg0172_bsbt_addr;
    regs->reg0175_bsbr_addr  = regs->reg0172_bsbt_addr;
    regs->reg0174_adr_bsbs   = regs->reg0172_bsbt_addr;

    regs->reg0180_adr_rfpt_h = 0xffffffff;
    regs->reg0181_adr_rfpb_h = 0;
    regs->reg0182_adr_rfpt_b = 0xffffffff;
    regs->reg0183_adr_rfpb_b = 0;


    mpp_dev_set_reg_offset(ctx->dev, 174, mpp_packet_get_length(task->packet));
    mpp_dev_set_reg_offset(ctx->dev, 172, mpp_buffer_get_size(enc_task->output));

    regs->reg0204_pic_ofst.pic_ofst_y = mpp_frame_get_offset_y(task->frame);
    regs->reg0204_pic_ofst.pic_ofst_x = mpp_frame_get_offset_x(task->frame);
}